

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_program.h
# Opt level: O0

void __thiscall t_program::add_struct(t_program *this,t_struct *ts)

{
  t_struct *local_18;
  t_struct *ts_local;
  t_program *this_local;
  
  local_18 = ts;
  ts_local = (t_struct *)this;
  std::vector<t_struct_*,_std::allocator<t_struct_*>_>::push_back(&this->objects_,&local_18);
  std::vector<t_struct_*,_std::allocator<t_struct_*>_>::push_back(&this->structs_,&local_18);
  return;
}

Assistant:

void add_struct(t_struct* ts) {
    objects_.push_back(ts);
    structs_.push_back(ts);
  }